

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::clear
          (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this)

{
  iterator S;
  iterator E;
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this_local;
  
  S = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
  E = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range(S,E);
  (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size = 0;
  return;
}

Assistant:

void clear() {
    this->destroy_range(this->begin(), this->end());
    this->Size = 0;
  }